

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O1

void MatchFinder_CheckLimits(CMatchFinder *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  CLzRef *pCVar4;
  uint uVar5;
  uint uVar6;
  UInt32 lenLimit;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  CLzRef CVar11;
  
  if (p->pos == 0xffffffff) {
    uVar5 = -p->historySize - 2 & 0xfffffc00;
    sVar3 = p->numRefs;
    if (sVar3 != 0) {
      pCVar4 = p->hash;
      sVar10 = 0;
      do {
        uVar6 = pCVar4[sVar10];
        CVar11 = uVar6 - uVar5;
        if (uVar6 < uVar5) {
          CVar11 = 0;
        }
        pCVar4[sVar10] = CVar11;
        sVar10 = sVar10 + 1;
      } while (sVar3 != sVar10);
    }
    uVar1 = p->pos;
    uVar2 = p->posLimit;
    p->pos = uVar1 - uVar5;
    p->posLimit = uVar2 - uVar5;
    p->streamPos = p->streamPos - uVar5;
  }
  if (p->streamEndWasReached == '\0') {
    uVar5 = p->streamPos - p->pos;
    if (p->keepSizeAfter == uVar5) {
      if (p->directInput == '\0') {
        if (p->bufferBase + ((ulong)p->blockSize - (long)p->buffer) <=
            (Byte *)(ulong)p->keepSizeAfter) {
          memmove(p->bufferBase,p->buffer + -(ulong)p->keepSizeBefore,
                  (ulong)uVar5 + (ulong)p->keepSizeBefore);
          p->buffer = p->bufferBase + p->keepSizeBefore;
        }
      }
      MatchFinder_ReadBlock(p);
    }
  }
  if (p->cyclicBufferPos == p->cyclicBufferSize) {
    p->cyclicBufferPos = 0;
  }
  uVar5 = p->pos;
  uVar6 = p->cyclicBufferSize - p->cyclicBufferPos;
  if (~uVar5 <= uVar6) {
    uVar6 = ~uVar5;
  }
  uVar7 = p->streamPos - uVar5;
  uVar9 = uVar7 - p->keepSizeAfter;
  uVar8 = (uint)(uVar7 != 0);
  if (p->keepSizeAfter <= uVar7 && uVar9 != 0) {
    uVar8 = uVar9;
  }
  if (uVar6 <= uVar8) {
    uVar8 = uVar6;
  }
  if (p->matchMaxLen <= uVar7) {
    uVar7 = p->matchMaxLen;
  }
  p->lenLimit = uVar7;
  p->posLimit = uVar8 + uVar5;
  return;
}

Assistant:

static void MatchFinder_CheckLimits(CMatchFinder *p)
{
  if (p->pos == kMaxValForNormalize)
    MatchFinder_Normalize(p);
  if (!p->streamEndWasReached && p->keepSizeAfter == p->streamPos - p->pos)
    MatchFinder_CheckAndMoveAndRead(p);
  if (p->cyclicBufferPos == p->cyclicBufferSize)
    p->cyclicBufferPos = 0;
  MatchFinder_SetLimits(p);
}